

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

char * __thiscall spirv_cross::CompilerMSL::to_restrict(CompilerMSL *this,uint32_t id,bool space)

{
  bool bVar1;
  ID id_00;
  SPIRType *pSVar2;
  Bitset *pBVar3;
  char *pcVar4;
  Bitset flags;
  Bitset local_68;
  
  flags.lower = 0;
  flags.higher._M_h._M_buckets = &flags.higher._M_h._M_single_bucket;
  flags.higher._M_h._M_bucket_count = 1;
  flags.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  flags.higher._M_h._M_element_count = 0;
  flags.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  flags.higher._M_h._M_rehash_policy._M_next_resize = 0;
  flags.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if ((this->super_CompilerGLSL).super_Compiler.ir.ids.super_VectorView<spirv_cross::Variant>.ptr
      [id].type == TypeVariable) {
    id_00.id = Compiler::expression_type_id((Compiler *)this,id);
    pSVar2 = Compiler::expression_type((Compiler *)this,id);
    if ((pSVar2->basetype == Struct) &&
       ((bVar1 = Compiler::has_decoration((Compiler *)this,id_00,Block), bVar1 ||
        (bVar1 = Compiler::has_decoration((Compiler *)this,id_00,BufferBlock), bVar1)))) {
      Compiler::get_buffer_block_flags(&local_68,(Compiler *)this,(VariableID)id);
      Bitset::operator=(&flags,&local_68);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&local_68.higher._M_h);
    }
    else {
      pBVar3 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
      Bitset::operator=(&flags,pBVar3);
    }
  }
  else {
    pBVar3 = Compiler::get_decoration_bitset((Compiler *)this,(ID)id);
    Bitset::operator=(&flags,pBVar3);
  }
  if (((flags.lower & 0x80000) != 0) || (bVar1 = Bitset::get(&flags,0x14eb), bVar1)) {
    pcVar4 = "__restrict";
    if (space) {
      pcVar4 = "__restrict ";
    }
  }
  else {
    pcVar4 = "";
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&flags.higher._M_h);
  return pcVar4;
}

Assistant:

const char *CompilerMSL::to_restrict(uint32_t id, bool space)
{
	// This can be called for variable pointer contexts as well, so be very careful about which method we choose.
	Bitset flags;
	if (ir.ids[id].get_type() == TypeVariable)
	{
		uint32_t type_id = expression_type_id(id);
		auto &type = expression_type(id);
		if (type.basetype == SPIRType::Struct &&
		    (has_decoration(type_id, DecorationBlock) || has_decoration(type_id, DecorationBufferBlock)))
			flags = get_buffer_block_flags(id);
		else
			flags = get_decoration_bitset(id);
	}
	else
		flags = get_decoration_bitset(id);

	return flags.get(DecorationRestrict) || flags.get(DecorationRestrictPointerEXT) ?
	       (space ? "__restrict " : "__restrict") : "";
}